

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

TimeInfo * __thiscall
absl::TimeZone::At(TimeInfo *__return_storage_ptr__,TimeZone *this,CivilSecond ct)

{
  bool *normalized;
  Time TVar1;
  civil_lookup cl;
  civil_second cs;
  civil_lookup local_48;
  civil_second local_28;
  
  local_28.f_.y = ct.f_.y;
  local_28.f_._8_4_ = ct.f_._8_4_;
  normalized = (bool *)(ct.f_._8_8_ >> 0x20);
  local_28.f_.ss = ct.f_.ss;
  time_internal::cctz::time_zone::lookup(&local_48,(time_zone *)this,&local_28);
  if (local_48.kind < (REPEATED|SKIPPED)) {
    __return_storage_ptr__->kind = local_48.kind;
  }
  TVar1 = anon_unknown_8::MakeTimeWithOverflow(&local_48.pre,&local_28,(time_zone *)this,normalized)
  ;
  (__return_storage_ptr__->pre).rep_.rep_hi_ = TVar1.rep_.rep_hi_;
  (__return_storage_ptr__->pre).rep_.rep_lo_ = TVar1.rep_.rep_lo_;
  TVar1 = anon_unknown_8::MakeTimeWithOverflow
                    (&local_48.trans,&local_28,(time_zone *)this,normalized);
  (__return_storage_ptr__->trans).rep_.rep_hi_ = TVar1.rep_.rep_hi_;
  (__return_storage_ptr__->trans).rep_.rep_lo_ = TVar1.rep_.rep_lo_;
  TVar1 = anon_unknown_8::MakeTimeWithOverflow
                    (&local_48.post,&local_28,(time_zone *)this,normalized);
  (__return_storage_ptr__->post).rep_.rep_hi_ = TVar1.rep_.rep_hi_;
  (__return_storage_ptr__->post).rep_.rep_lo_ = TVar1.rep_.rep_lo_;
  return __return_storage_ptr__;
}

Assistant:

absl::TimeZone::TimeInfo TimeZone::At(CivilSecond ct) const {
  const cctz::civil_second cs(ct);
  const auto cl = cz_.lookup(cs);

  TimeZone::TimeInfo ti;
  switch (cl.kind) {
    case cctz::time_zone::civil_lookup::UNIQUE:
      ti.kind = TimeZone::TimeInfo::UNIQUE;
      break;
    case cctz::time_zone::civil_lookup::SKIPPED:
      ti.kind = TimeZone::TimeInfo::SKIPPED;
      break;
    case cctz::time_zone::civil_lookup::REPEATED:
      ti.kind = TimeZone::TimeInfo::REPEATED;
      break;
  }
  ti.pre = MakeTimeWithOverflow(cl.pre, cs, cz_);
  ti.trans = MakeTimeWithOverflow(cl.trans, cs, cz_);
  ti.post = MakeTimeWithOverflow(cl.post, cs, cz_);
  return ti;
}